

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

size_t __thiscall slang::syntax::SyntaxNode::getChildCount(SyntaxNode *this)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar1 = (SyntaxNode *)(ulong)this->kind;
  switch(pSVar1) {
  case (SyntaxNode *)0x0:
    break;
  case (SyntaxNode *)0x1:
  case (SyntaxNode *)0x2:
  case (SyntaxNode *)0x3:
    pSVar1 = this[1].parent;
    break;
  case (SyntaxNode *)0x4:
  case (SyntaxNode *)0x2f:
  case (SyntaxNode *)0x31:
  case (SyntaxNode *)0x45:
  case (SyntaxNode *)0x60:
  case (SyntaxNode *)0x62:
  case (SyntaxNode *)0x63:
  case (SyntaxNode *)0x73:
  case (SyntaxNode *)0x78:
  case (SyntaxNode *)0x8a:
  case (SyntaxNode *)0x8b:
  case (SyntaxNode *)0x8c:
  case (SyntaxNode *)0x95:
  case (SyntaxNode *)0xb6:
  case (SyntaxNode *)0xbe:
  case (SyntaxNode *)0xc2:
  case (SyntaxNode *)0xc7:
  case (SyntaxNode *)0xca:
  case (SyntaxNode *)0xce:
  case (SyntaxNode *)0xd5:
  case (SyntaxNode *)0xef:
  case (SyntaxNode *)0xf5:
  case (SyntaxNode *)0x101:
  case (SyntaxNode *)0x117:
  case (SyntaxNode *)0x11c:
  case (SyntaxNode *)0x122:
  case (SyntaxNode *)0x128:
  case (SyntaxNode *)0x12b:
  case (SyntaxNode *)0x133:
  case (SyntaxNode *)0x13d:
  case (SyntaxNode *)0x146:
  case (SyntaxNode *)0x158:
  case (SyntaxNode *)0x15b:
  case (SyntaxNode *)0x165:
  case (SyntaxNode *)0x166:
  case (SyntaxNode *)0x167:
  case (SyntaxNode *)0x168:
  case (SyntaxNode *)0x16a:
  case (SyntaxNode *)0x173:
  case (SyntaxNode *)0x17c:
  case (SyntaxNode *)0x180:
  case (SyntaxNode *)0x187:
  case (SyntaxNode *)0x19d:
  case (SyntaxNode *)0x19f:
  case (SyntaxNode *)0x1ab:
  case (SyntaxNode *)0x1bb:
  case (SyntaxNode *)0x1c8:
  case (SyntaxNode *)0x1cc:
  case (SyntaxNode *)0x1ce:
  case (SyntaxNode *)0x1dd:
  case (SyntaxNode *)0x1e8:
  case (SyntaxNode *)0x1ec:
  case (SyntaxNode *)0x1ef:
    pSVar1 = (SyntaxNode *)0x5;
    break;
  case (SyntaxNode *)0x5:
  case (SyntaxNode *)0x20:
  case (SyntaxNode *)0x24:
  case (SyntaxNode *)0x26:
  case (SyntaxNode *)0x30:
  case (SyntaxNode *)0x49:
  case (SyntaxNode *)0x4e:
  case (SyntaxNode *)0x4f:
  case (SyntaxNode *)0x50:
  case (SyntaxNode *)0x51:
  case (SyntaxNode *)0x52:
  case (SyntaxNode *)0x54:
  case (SyntaxNode *)0x58:
  case (SyntaxNode *)0x5e:
  case (SyntaxNode *)0x5f:
  case (SyntaxNode *)0x66:
  case (SyntaxNode *)0x70:
  case (SyntaxNode *)0x76:
  case (SyntaxNode *)0x7a:
  case (SyntaxNode *)0x7c:
  case (SyntaxNode *)0x84:
  case (SyntaxNode *)0x86:
  case (SyntaxNode *)0x8e:
  case (SyntaxNode *)0x8f:
  case (SyntaxNode *)0x92:
  case (SyntaxNode *)0x94:
  case (SyntaxNode *)0x97:
  case (SyntaxNode *)0x9b:
  case (SyntaxNode *)0x9d:
  case (SyntaxNode *)0x9e:
  case (SyntaxNode *)0x9f:
  case (SyntaxNode *)0xa0:
  case (SyntaxNode *)0xa5:
  case (SyntaxNode *)0xa6:
  case (SyntaxNode *)0xaa:
  case (SyntaxNode *)0xae:
  case (SyntaxNode *)0xaf:
  case (SyntaxNode *)0xb0:
  case (SyntaxNode *)0xb1:
  case (SyntaxNode *)0xb2:
  case (SyntaxNode *)0xb9:
  case (SyntaxNode *)0xbc:
  case (SyntaxNode *)0xd6:
  case (SyntaxNode *)0xd8:
  case (SyntaxNode *)0xdd:
  case (SyntaxNode *)0xe0:
  case (SyntaxNode *)0xe3:
  case (SyntaxNode *)0xeb:
  case (SyntaxNode *)0xf0:
  case (SyntaxNode *)0xf7:
  case (SyntaxNode *)0xf8:
  case (SyntaxNode *)0x111:
  case (SyntaxNode *)0x112:
  case (SyntaxNode *)0x114:
  case (SyntaxNode *)0x115:
  case (SyntaxNode *)0x11d:
  case (SyntaxNode *)0x129:
  case (SyntaxNode *)0x12a:
  case (SyntaxNode *)0x134:
  case (SyntaxNode *)0x13c:
  case (SyntaxNode *)0x144:
  case (SyntaxNode *)0x15e:
  case (SyntaxNode *)0x163:
  case (SyntaxNode *)0x171:
  case (SyntaxNode *)0x176:
  case (SyntaxNode *)0x184:
  case (SyntaxNode *)0x186:
  case (SyntaxNode *)0x18e:
  case (SyntaxNode *)0x197:
  case (SyntaxNode *)0x19c:
  case (SyntaxNode *)0x1a4:
  case (SyntaxNode *)0x1a5:
  case (SyntaxNode *)0x1bc:
  case (SyntaxNode *)0x1be:
  case (SyntaxNode *)0x1c1:
  case (SyntaxNode *)0x1c4:
  case (SyntaxNode *)0x1cf:
  case (SyntaxNode *)0x1dc:
  case (SyntaxNode *)0x1df:
  case (SyntaxNode *)0x1e0:
  case (SyntaxNode *)0x1ea:
  case (SyntaxNode *)0x1f7:
  case (SyntaxNode *)0x1fb:
    pSVar1 = (SyntaxNode *)0x2;
    break;
  case (SyntaxNode *)0x6:
  case (SyntaxNode *)0x7:
  case (SyntaxNode *)0xc:
  case (SyntaxNode *)0x10:
  case (SyntaxNode *)0x12:
  case (SyntaxNode *)0x13:
  case (SyntaxNode *)0x14:
  case (SyntaxNode *)0x15:
  case (SyntaxNode *)0x18:
  case (SyntaxNode *)0x1f:
  case (SyntaxNode *)0x28:
  case (SyntaxNode *)0x2c:
  case (SyntaxNode *)0x2d:
  case (SyntaxNode *)0x2e:
  case (SyntaxNode *)0x35:
  case (SyntaxNode *)0x39:
  case (SyntaxNode *)0x3b:
  case (SyntaxNode *)0x3f:
  case (SyntaxNode *)0x48:
  case (SyntaxNode *)0x4c:
  case (SyntaxNode *)0x4d:
  case (SyntaxNode *)0x6c:
  case (SyntaxNode *)0x75:
  case (SyntaxNode *)0x7e:
  case (SyntaxNode *)0x7f:
  case (SyntaxNode *)0x80:
  case (SyntaxNode *)0x82:
  case (SyntaxNode *)0x87:
  case (SyntaxNode *)0x89:
  case (SyntaxNode *)0x8d:
  case (SyntaxNode *)0x90:
  case (SyntaxNode *)0x91:
  case (SyntaxNode *)0x99:
  case (SyntaxNode *)0xad:
  case (SyntaxNode *)0xbb:
  case (SyntaxNode *)0xbf:
  case (SyntaxNode *)0xc8:
  case (SyntaxNode *)0xd0:
  case (SyntaxNode *)0xd1:
  case (SyntaxNode *)0xd2:
  case (SyntaxNode *)0xd3:
  case (SyntaxNode *)0xd4:
  case (SyntaxNode *)0xe7:
  case (SyntaxNode *)0xec:
  case (SyntaxNode *)0xfb:
  case (SyntaxNode *)0xfc:
  case (SyntaxNode *)0xfd:
  case (SyntaxNode *)0xff:
  case (SyntaxNode *)0x103:
  case (SyntaxNode *)0x104:
  case (SyntaxNode *)0x105:
  case (SyntaxNode *)0x106:
  case (SyntaxNode *)0x107:
  case (SyntaxNode *)0x108:
  case (SyntaxNode *)0x109:
  case (SyntaxNode *)0x10a:
  case (SyntaxNode *)0x118:
  case (SyntaxNode *)0x119:
  case (SyntaxNode *)0x11b:
  case (SyntaxNode *)0x124:
  case (SyntaxNode *)0x125:
  case (SyntaxNode *)0x126:
  case (SyntaxNode *)0x12f:
  case (SyntaxNode *)0x137:
  case (SyntaxNode *)0x138:
  case (SyntaxNode *)0x13f:
  case (SyntaxNode *)0x148:
  case (SyntaxNode *)0x14a:
  case (SyntaxNode *)0x14f:
  case (SyntaxNode *)0x150:
  case (SyntaxNode *)0x157:
  case (SyntaxNode *)0x15d:
  case (SyntaxNode *)0x161:
  case (SyntaxNode *)0x170:
  case (SyntaxNode *)0x18f:
  case (SyntaxNode *)0x19e:
  case (SyntaxNode *)0x1a2:
  case (SyntaxNode *)0x1a3:
  case (SyntaxNode *)0x1a9:
  case (SyntaxNode *)0x1ae:
  case (SyntaxNode *)0x1af:
  case (SyntaxNode *)0x1b9:
  case (SyntaxNode *)0x1bd:
  case (SyntaxNode *)0x1bf:
  case (SyntaxNode *)0x1c2:
  case (SyntaxNode *)0x1c6:
  case (SyntaxNode *)0x1ca:
  case (SyntaxNode *)0x1eb:
  case (SyntaxNode *)0x1f3:
  case (SyntaxNode *)0x1f4:
  case (SyntaxNode *)0x1f9:
  case (SyntaxNode *)0x1fa:
  case (SyntaxNode *)0x1fc:
  case (SyntaxNode *)0x1fe:
    pSVar1 = (SyntaxNode *)0x4;
    break;
  case (SyntaxNode *)0x8:
  case (SyntaxNode *)0x9:
  case (SyntaxNode *)0xa:
  case (SyntaxNode *)0xb:
  case (SyntaxNode *)0xd:
  case (SyntaxNode *)0xe:
  case (SyntaxNode *)0xf:
  case (SyntaxNode *)0x11:
  case (SyntaxNode *)0x1b:
  case (SyntaxNode *)0x1e:
  case (SyntaxNode *)0x21:
  case (SyntaxNode *)0x23:
  case (SyntaxNode *)0x29:
  case (SyntaxNode *)0x2a:
  case (SyntaxNode *)0x2b:
  case (SyntaxNode *)0x34:
  case (SyntaxNode *)0x37:
  case (SyntaxNode *)0x3e:
  case (SyntaxNode *)0x41:
  case (SyntaxNode *)0x42:
  case (SyntaxNode *)0x44:
  case (SyntaxNode *)0x47:
  case (SyntaxNode *)0x4a:
  case (SyntaxNode *)0x53:
  case (SyntaxNode *)0x5c:
  case (SyntaxNode *)0x61:
  case (SyntaxNode *)0x6b:
  case (SyntaxNode *)0x6d:
  case (SyntaxNode *)0x74:
  case (SyntaxNode *)0x77:
  case (SyntaxNode *)0x79:
  case (SyntaxNode *)0x81:
  case (SyntaxNode *)0x88:
  case (SyntaxNode *)0x96:
  case (SyntaxNode *)0x9a:
  case (SyntaxNode *)0x9c:
  case (SyntaxNode *)0xa3:
  case (SyntaxNode *)0xa7:
  case (SyntaxNode *)0xb7:
  case (SyntaxNode *)0xbd:
  case (SyntaxNode *)0xc1:
  case (SyntaxNode *)0xc3:
  case (SyntaxNode *)0xc5:
  case (SyntaxNode *)0xcd:
  case (SyntaxNode *)0xd9:
  case (SyntaxNode *)0xdb:
  case (SyntaxNode *)0xdc:
  case (SyntaxNode *)0xde:
  case (SyntaxNode *)0xe4:
  case (SyntaxNode *)0xe5:
  case (SyntaxNode *)0xe6:
  case (SyntaxNode *)0xe9:
  case (SyntaxNode *)0xea:
  case (SyntaxNode *)0xed:
  case (SyntaxNode *)0xee:
  case (SyntaxNode *)0xf1:
  case (SyntaxNode *)0xf3:
  case (SyntaxNode *)0xf4:
  case (SyntaxNode *)0xf9:
  case (SyntaxNode *)0xfa:
  case (SyntaxNode *)0x102:
  case (SyntaxNode *)0x10b:
  case (SyntaxNode *)0x10c:
  case (SyntaxNode *)0x110:
  case (SyntaxNode *)0x113:
  case (SyntaxNode *)0x116:
  case (SyntaxNode *)0x11a:
  case (SyntaxNode *)0x11f:
  case (SyntaxNode *)0x121:
  case (SyntaxNode *)0x127:
  case (SyntaxNode *)0x12d:
  case (SyntaxNode *)0x131:
  case (SyntaxNode *)0x136:
  case (SyntaxNode *)0x13b:
  case (SyntaxNode *)0x13e:
  case (SyntaxNode *)0x140:
  case (SyntaxNode *)0x141:
  case (SyntaxNode *)0x14b:
  case (SyntaxNode *)0x14d:
  case (SyntaxNode *)0x14e:
  case (SyntaxNode *)0x151:
  case (SyntaxNode *)0x152:
  case (SyntaxNode *)0x153:
  case (SyntaxNode *)0x154:
  case (SyntaxNode *)0x155:
  case (SyntaxNode *)0x156:
  case (SyntaxNode *)0x15c:
  case (SyntaxNode *)0x15f:
  case (SyntaxNode *)0x160:
  case (SyntaxNode *)0x162:
  case (SyntaxNode *)0x16d:
  case (SyntaxNode *)0x16f:
  case (SyntaxNode *)0x172:
  case (SyntaxNode *)0x174:
  case (SyntaxNode *)0x17b:
  case (SyntaxNode *)0x183:
  case (SyntaxNode *)0x188:
  case (SyntaxNode *)0x189:
  case (SyntaxNode *)0x18a:
  case (SyntaxNode *)0x18b:
  case (SyntaxNode *)0x18c:
  case (SyntaxNode *)0x192:
  case (SyntaxNode *)0x194:
  case (SyntaxNode *)0x195:
  case (SyntaxNode *)0x196:
  case (SyntaxNode *)0x19b:
  case (SyntaxNode *)0x1a0:
  case (SyntaxNode *)0x1a1:
  case (SyntaxNode *)0x1ac:
  case (SyntaxNode *)0x1ad:
  case (SyntaxNode *)0x1b3:
  case (SyntaxNode *)0x1b4:
  case (SyntaxNode *)0x1b7:
  case (SyntaxNode *)0x1ba:
  case (SyntaxNode *)0x1c3:
  case (SyntaxNode *)0x1c5:
  case (SyntaxNode *)0x1cd:
  case (SyntaxNode *)0x1d0:
  case (SyntaxNode *)0x1d1:
  case (SyntaxNode *)0x1d2:
  case (SyntaxNode *)0x1d3:
  case (SyntaxNode *)0x1d4:
  case (SyntaxNode *)0x1d5:
  case (SyntaxNode *)0x1d6:
  case (SyntaxNode *)0x1d7:
  case (SyntaxNode *)0x1d8:
  case (SyntaxNode *)0x1d9:
  case (SyntaxNode *)0x1da:
  case (SyntaxNode *)0x1db:
  case (SyntaxNode *)0x1e3:
  case (SyntaxNode *)0x1e5:
  case (SyntaxNode *)0x1e6:
  case (SyntaxNode *)0x1e9:
  case (SyntaxNode *)0x1f8:
  case (SyntaxNode *)0x1fd:
    pSVar1 = (SyntaxNode *)0x3;
    break;
  case (SyntaxNode *)0x16:
  case (SyntaxNode *)0x17:
  case (SyntaxNode *)0x19:
  case (SyntaxNode *)0x1a:
  case (SyntaxNode *)0x25:
  case (SyntaxNode *)0x33:
  case (SyntaxNode *)0x38:
  case (SyntaxNode *)0x40:
  case (SyntaxNode *)0x59:
  case (SyntaxNode *)0x64:
  case (SyntaxNode *)0x7d:
  case (SyntaxNode *)0xa1:
  case (SyntaxNode *)0xa2:
  case (SyntaxNode *)0xa4:
  case (SyntaxNode *)0xa8:
  case (SyntaxNode *)0xa9:
  case (SyntaxNode *)0xab:
  case (SyntaxNode *)0xb3:
  case (SyntaxNode *)0xb8:
  case (SyntaxNode *)0xba:
  case (SyntaxNode *)0xd7:
  case (SyntaxNode *)0xe8:
  case (SyntaxNode *)0xf2:
  case (SyntaxNode *)0x100:
  case (SyntaxNode *)0x10f:
  case (SyntaxNode *)0x11e:
  case (SyntaxNode *)0x120:
  case (SyntaxNode *)0x12e:
  case (SyntaxNode *)0x135:
  case (SyntaxNode *)0x13a:
  case (SyntaxNode *)0x142:
  case (SyntaxNode *)0x143:
  case (SyntaxNode *)0x145:
  case (SyntaxNode *)0x16e:
  case (SyntaxNode *)0x177:
  case (SyntaxNode *)0x178:
  case (SyntaxNode *)0x179:
  case (SyntaxNode *)0x17a:
  case (SyntaxNode *)0x17e:
  case (SyntaxNode *)0x181:
  case (SyntaxNode *)0x190:
  case (SyntaxNode *)0x193:
  case (SyntaxNode *)0x198:
  case (SyntaxNode *)0x199:
  case (SyntaxNode *)0x19a:
  case (SyntaxNode *)0x1a7:
  case (SyntaxNode *)0x1a8:
  case (SyntaxNode *)0x1b0:
  case (SyntaxNode *)0x1b1:
  case (SyntaxNode *)0x1b6:
  case (SyntaxNode *)0x1b8:
  case (SyntaxNode *)0x1c0:
  case (SyntaxNode *)0x1de:
  case (SyntaxNode *)0x1e1:
  case (SyntaxNode *)0x1e4:
  case (SyntaxNode *)0x1e7:
  case (SyntaxNode *)0x1ee:
  case (SyntaxNode *)0x1f2:
  case (SyntaxNode *)0x1f5:
  case (SyntaxNode *)0x1f6:
    pSVar1 = (SyntaxNode *)0x1;
    break;
  case (SyntaxNode *)0x1c:
  case (SyntaxNode *)0x22:
  case (SyntaxNode *)0x43:
  case (SyntaxNode *)0x68:
  case (SyntaxNode *)0x69:
  case (SyntaxNode *)0x71:
  case (SyntaxNode *)0x72:
  case (SyntaxNode *)0x83:
  case (SyntaxNode *)0xb4:
  case (SyntaxNode *)0x130:
  case (SyntaxNode *)0x175:
  case (SyntaxNode *)0x17f:
  case (SyntaxNode *)0x1aa:
  case (SyntaxNode *)0x1cb:
  case (SyntaxNode *)0x1e2:
  case (SyntaxNode *)0x1ed:
    pSVar1 = (SyntaxNode *)0x8;
    break;
  case (SyntaxNode *)0x1d:
  case (SyntaxNode *)0x32:
  case (SyntaxNode *)0x3a:
  case (SyntaxNode *)0x85:
  case (SyntaxNode *)0xb5:
  case (SyntaxNode *)0xcf:
  case (SyntaxNode *)0xda:
  case (SyntaxNode *)0xf6:
  case (SyntaxNode *)0xfe:
  case (SyntaxNode *)0x10e:
  case (SyntaxNode *)0x123:
  case (SyntaxNode *)0x149:
  case (SyntaxNode *)0x14c:
  case (SyntaxNode *)0x159:
  case (SyntaxNode *)0x15a:
  case (SyntaxNode *)0x16b:
  case (SyntaxNode *)0x191:
  case (SyntaxNode *)0x1a6:
  case (SyntaxNode *)0x1c9:
  case (SyntaxNode *)0x1f0:
  case (SyntaxNode *)0x1f1:
    pSVar1 = (SyntaxNode *)0x7;
    break;
  case (SyntaxNode *)0x27:
  case (SyntaxNode *)0x36:
  case (SyntaxNode *)0x3c:
  case (SyntaxNode *)0x55:
  case (SyntaxNode *)0x56:
  case (SyntaxNode *)0x57:
  case (SyntaxNode *)0x5a:
  case (SyntaxNode *)0x65:
  case (SyntaxNode *)0x7b:
  case (SyntaxNode *)0x98:
  case (SyntaxNode *)0xac:
  case (SyntaxNode *)0xc0:
  case (SyntaxNode *)0xc6:
  case (SyntaxNode *)0xc9:
  case (SyntaxNode *)0xcb:
  case (SyntaxNode *)0xcc:
  case (SyntaxNode *)0xdf:
  case (SyntaxNode *)0xe1:
  case (SyntaxNode *)0xe2:
  case (SyntaxNode *)0x12c:
  case (SyntaxNode *)0x132:
  case (SyntaxNode *)0x139:
  case (SyntaxNode *)0x147:
  case (SyntaxNode *)0x164:
  case (SyntaxNode *)0x169:
  case (SyntaxNode *)0x17d:
  case (SyntaxNode *)0x182:
  case (SyntaxNode *)0x185:
  case (SyntaxNode *)0x1b2:
  case (SyntaxNode *)0x1b5:
  case (SyntaxNode *)0x1c7:
    pSVar1 = (SyntaxNode *)0x6;
    break;
  case (SyntaxNode *)0x3d:
  case (SyntaxNode *)0x4b:
  case (SyntaxNode *)0x6f:
  case (SyntaxNode *)0x16c:
  case (SyntaxNode *)0x18d:
    pSVar1 = (SyntaxNode *)0xa;
    break;
  case (SyntaxNode *)0x46:
    pSVar1 = (SyntaxNode *)0xc;
    break;
  case (SyntaxNode *)0x5b:
  case (SyntaxNode *)0x67:
  case (SyntaxNode *)0x6a:
  case (SyntaxNode *)0x6e:
  case (SyntaxNode *)0x93:
    pSVar1 = (SyntaxNode *)0x9;
    break;
  case (SyntaxNode *)0x5d:
  case (SyntaxNode *)0xc4:
    pSVar1 = (SyntaxNode *)0xb;
    break;
  case (SyntaxNode *)0x10d:
    pSVar1 = (SyntaxNode *)0xd;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
      local_b0.field_2._M_allocated_capacity = *psVar3;
      local_b0.field_2._8_8_ = plVar2[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar3;
    }
    local_b0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x213);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar2;
    plVar4 = plVar2 + 2;
    if (local_90 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar2;
    plVar4 = plVar2 + 2;
    if (local_f0 == plVar4) {
      local_e0 = *plVar4;
      lStack_d8 = plVar2[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar4;
    }
    local_e8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (size_t)pSVar1;
}

Assistant:

size_t SyntaxNode::getChildCount() const {
    switch (kind) {
        case SyntaxKind::Unknown: return 0;
        case SyntaxKind::SyntaxList:
        case SyntaxKind::TokenList:
        case SyntaxKind::SeparatedList:
            return ((const SyntaxListBase*)this)->getChildCount();
        case SyntaxKind::AcceptOnPropertyExpr: return 5;
        case SyntaxKind::ActionBlock: return 2;
        case SyntaxKind::AddAssignmentExpression: return 4;
        case SyntaxKind::AddExpression: return 4;
        case SyntaxKind::AlwaysBlock: return 3;
        case SyntaxKind::AlwaysCombBlock: return 3;
        case SyntaxKind::AlwaysFFBlock: return 3;
        case SyntaxKind::AlwaysLatchBlock: return 3;
        case SyntaxKind::AndAssignmentExpression: return 4;
        case SyntaxKind::AndPropertyExpr: return 3;
        case SyntaxKind::AndSequenceExpr: return 3;
        case SyntaxKind::AnsiPortList: return 3;
        case SyntaxKind::AnsiUdpPortList: return 4;
        case SyntaxKind::ArgumentList: return 3;
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression: return 4;
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression: return 4;
        case SyntaxKind::ArithmeticShiftLeftExpression: return 4;
        case SyntaxKind::ArithmeticShiftRightExpression: return 4;
        case SyntaxKind::ArrayAndMethod: return 1;
        case SyntaxKind::ArrayOrMethod: return 1;
        case SyntaxKind::ArrayOrRandomizeMethodExpression: return 4;
        case SyntaxKind::ArrayUniqueMethod: return 1;
        case SyntaxKind::ArrayXorMethod: return 1;
        case SyntaxKind::AscendingRangeSelect: return 3;
        case SyntaxKind::AssertPropertyStatement: return 8;
        case SyntaxKind::AssertionItemPort: return 7;
        case SyntaxKind::AssertionItemPortList: return 3;
        case SyntaxKind::AssignmentExpression: return 4;
        case SyntaxKind::AssignmentPatternExpression: return 2;
        case SyntaxKind::AssignmentPatternItem: return 3;
        case SyntaxKind::AssumePropertyStatement: return 8;
        case SyntaxKind::AttributeInstance: return 3;
        case SyntaxKind::AttributeSpec: return 2;
        case SyntaxKind::BadExpression: return 1;
        case SyntaxKind::BeginKeywordsDirective: return 2;
        case SyntaxKind::BinSelectWithFilterExpr: return 6;
        case SyntaxKind::BinaryAndExpression: return 4;
        case SyntaxKind::BinaryBinsSelectExpr: return 3;
        case SyntaxKind::BinaryBlockEventExpression: return 3;
        case SyntaxKind::BinaryEventExpression: return 3;
        case SyntaxKind::BinaryOrExpression: return 4;
        case SyntaxKind::BinaryXnorExpression: return 4;
        case SyntaxKind::BinaryXorExpression: return 4;
        case SyntaxKind::BindDirective: return 5;
        case SyntaxKind::BindTargetList: return 2;
        case SyntaxKind::BinsSelectConditionExpr: return 5;
        case SyntaxKind::BinsSelection: return 7;
        case SyntaxKind::BitSelect: return 1;
        case SyntaxKind::BitType: return 3;
        case SyntaxKind::BlockCoverageEvent: return 4;
        case SyntaxKind::BlockingEventTriggerStatement: return 6;
        case SyntaxKind::ByteType: return 3;
        case SyntaxKind::CHandleType: return 1;
        case SyntaxKind::CaseEqualityExpression: return 4;
        case SyntaxKind::CaseGenerate: return 7;
        case SyntaxKind::CaseInequalityExpression: return 4;
        case SyntaxKind::CasePropertyExpr: return 6;
        case SyntaxKind::CaseStatement: return 10;
        case SyntaxKind::CastExpression: return 3;
        case SyntaxKind::CellConfigRule: return 4;
        case SyntaxKind::CellDefineDirective: return 1;
        case SyntaxKind::ChargeStrength: return 3;
        case SyntaxKind::CheckerDataDeclaration: return 3;
        case SyntaxKind::CheckerDeclaration: return 8;
        case SyntaxKind::CheckerInstanceStatement: return 3;
        case SyntaxKind::CheckerInstantiation: return 5;
        case SyntaxKind::ClassDeclaration: return 12;
        case SyntaxKind::ClassMethodDeclaration: return 3;
        case SyntaxKind::ClassMethodPrototype: return 4;
        case SyntaxKind::ClassName: return 2;
        case SyntaxKind::ClassPropertyDeclaration: return 3;
        case SyntaxKind::ClockingDeclaration: return 10;
        case SyntaxKind::ClockingDirection: return 4;
        case SyntaxKind::ClockingItem: return 4;
        case SyntaxKind::ClockingPropertyExpr: return 2;
        case SyntaxKind::ClockingSequenceExpr: return 2;
        case SyntaxKind::ClockingSkew: return 2;
        case SyntaxKind::ColonExpressionClause: return 2;
        case SyntaxKind::CompilationUnit: return 2;
        case SyntaxKind::ConcatenationExpression: return 3;
        case SyntaxKind::ConcurrentAssertionMember: return 2;
        case SyntaxKind::ConditionalConstraint: return 6;
        case SyntaxKind::ConditionalExpression: return 6;
        case SyntaxKind::ConditionalPathDeclaration: return 6;
        case SyntaxKind::ConditionalPattern: return 2;
        case SyntaxKind::ConditionalPredicate: return 1;
        case SyntaxKind::ConditionalPropertyExpr: return 6;
        case SyntaxKind::ConditionalStatement: return 9;
        case SyntaxKind::ConfigCellIdentifier: return 3;
        case SyntaxKind::ConfigDeclaration: return 11;
        case SyntaxKind::ConfigInstanceIdentifier: return 2;
        case SyntaxKind::ConfigLiblist: return 2;
        case SyntaxKind::ConfigUseClause: return 5;
        case SyntaxKind::ConstraintBlock: return 3;
        case SyntaxKind::ConstraintDeclaration: return 5;
        case SyntaxKind::ConstraintPrototype: return 5;
        case SyntaxKind::ConstructorName: return 1;
        case SyntaxKind::ContinuousAssign: return 6;
        case SyntaxKind::CopyClassExpression: return 2;
        case SyntaxKind::CoverCross: return 9;
        case SyntaxKind::CoverPropertyStatement: return 8;
        case SyntaxKind::CoverSequenceStatement: return 8;
        case SyntaxKind::CoverageBins: return 9;
        case SyntaxKind::CoverageBinsArraySize: return 3;
        case SyntaxKind::CoverageIffClause: return 4;
        case SyntaxKind::CoverageOption: return 3;
        case SyntaxKind::CovergroupDeclaration: return 9;
        case SyntaxKind::Coverpoint: return 10;
        case SyntaxKind::CycleDelay: return 2;
        case SyntaxKind::DPIExport: return 8;
        case SyntaxKind::DPIImport: return 8;
        case SyntaxKind::DataDeclaration: return 5;
        case SyntaxKind::Declarator: return 3;
        case SyntaxKind::DefParam: return 4;
        case SyntaxKind::DefParamAssignment: return 2;
        case SyntaxKind::DefaultCaseItem: return 3;
        case SyntaxKind::DefaultClockingReference: return 5;
        case SyntaxKind::DefaultConfigRule: return 3;
        case SyntaxKind::DefaultCoverageBinInitializer: return 2;
        case SyntaxKind::DefaultDisableDeclaration: return 6;
        case SyntaxKind::DefaultNetTypeDirective: return 2;
        case SyntaxKind::DefaultPatternKeyExpression: return 1;
        case SyntaxKind::DefaultPropertyCaseItem: return 4;
        case SyntaxKind::DefaultRsCaseItem: return 4;
        case SyntaxKind::DefaultSkewItem: return 4;
        case SyntaxKind::DeferredAssertion: return 3;
        case SyntaxKind::DefineDirective: return 4;
        case SyntaxKind::Delay3: return 8;
        case SyntaxKind::DelayControl: return 2;
        case SyntaxKind::DelayedSequenceElement: return 7;
        case SyntaxKind::DelayedSequenceExpr: return 2;
        case SyntaxKind::DelayedTerminalArg: return 4;
        case SyntaxKind::DescendingRangeSelect: return 3;
        case SyntaxKind::DisableConstraint: return 4;
        case SyntaxKind::DisableForkStatement: return 5;
        case SyntaxKind::DisableIff: return 5;
        case SyntaxKind::DisableStatement: return 5;
        case SyntaxKind::DistConstraintList: return 4;
        case SyntaxKind::DistItem: return 2;
        case SyntaxKind::DistWeight: return 2;
        case SyntaxKind::DivideAssignmentExpression: return 4;
        case SyntaxKind::DivideExpression: return 4;
        case SyntaxKind::DividerClause: return 2;
        case SyntaxKind::DoWhileStatement: return 9;
        case SyntaxKind::DotMemberClause: return 2;
        case SyntaxKind::DriveStrength: return 5;
        case SyntaxKind::EdgeControlSpecifier: return 3;
        case SyntaxKind::EdgeDescriptor: return 2;
        case SyntaxKind::EdgeSensitivePathSuffix: return 6;
        case SyntaxKind::ElabSystemTask: return 4;
        case SyntaxKind::ElementSelect: return 3;
        case SyntaxKind::ElementSelectExpression: return 2;
        case SyntaxKind::ElsIfDirective: return 3;
        case SyntaxKind::ElseClause: return 2;
        case SyntaxKind::ElseConstraintClause: return 2;
        case SyntaxKind::ElseDirective: return 2;
        case SyntaxKind::ElsePropertyClause: return 2;
        case SyntaxKind::EmptyArgument: return 1;
        case SyntaxKind::EmptyIdentifierName: return 1;
        case SyntaxKind::EmptyMember: return 3;
        case SyntaxKind::EmptyNonAnsiPort: return 1;
        case SyntaxKind::EmptyPortConnection: return 2;
        case SyntaxKind::EmptyQueueExpression: return 2;
        case SyntaxKind::EmptyStatement: return 3;
        case SyntaxKind::EmptyTimingCheckArg: return 1;
        case SyntaxKind::EndCellDefineDirective: return 1;
        case SyntaxKind::EndIfDirective: return 2;
        case SyntaxKind::EndKeywordsDirective: return 1;
        case SyntaxKind::EnumType: return 6;
        case SyntaxKind::EqualityExpression: return 4;
        case SyntaxKind::EqualsAssertionArgClause: return 2;
        case SyntaxKind::EqualsTypeClause: return 2;
        case SyntaxKind::EqualsValueClause: return 2;
        case SyntaxKind::EventControl: return 2;
        case SyntaxKind::EventControlWithExpression: return 2;
        case SyntaxKind::EventType: return 1;
        case SyntaxKind::ExpectPropertyStatement: return 8;
        case SyntaxKind::ExplicitAnsiPort: return 7;
        case SyntaxKind::ExplicitNonAnsiPort: return 5;
        case SyntaxKind::ExpressionConstraint: return 3;
        case SyntaxKind::ExpressionCoverageBinInitializer: return 1;
        case SyntaxKind::ExpressionOrDist: return 2;
        case SyntaxKind::ExpressionPattern: return 1;
        case SyntaxKind::ExpressionStatement: return 4;
        case SyntaxKind::ExpressionTimingCheckArg: return 2;
        case SyntaxKind::ExtendsClause: return 3;
        case SyntaxKind::ExternInterfaceMethod: return 5;
        case SyntaxKind::ExternModuleDecl: return 4;
        case SyntaxKind::ExternUdpDecl: return 6;
        case SyntaxKind::FinalBlock: return 3;
        case SyntaxKind::FirstMatchSequenceExpr: return 5;
        case SyntaxKind::FollowedByPropertyExpr: return 3;
        case SyntaxKind::ForLoopStatement: return 11;
        case SyntaxKind::ForVariableDeclaration: return 3;
        case SyntaxKind::ForeachLoopList: return 6;
        case SyntaxKind::ForeachLoopStatement: return 5;
        case SyntaxKind::ForeverStatement: return 4;
        case SyntaxKind::ForwardInterfaceClassTypedefDeclaration: return 6;
        case SyntaxKind::ForwardTypedefDeclaration: return 5;
        case SyntaxKind::FunctionDeclaration: return 6;
        case SyntaxKind::FunctionPort: return 6;
        case SyntaxKind::FunctionPortList: return 3;
        case SyntaxKind::FunctionPrototype: return 5;
        case SyntaxKind::GenerateBlock: return 7;
        case SyntaxKind::GenerateRegion: return 4;
        case SyntaxKind::GenvarDeclaration: return 4;
        case SyntaxKind::GreaterThanEqualExpression: return 4;
        case SyntaxKind::GreaterThanExpression: return 4;
        case SyntaxKind::HierarchicalInstance: return 4;
        case SyntaxKind::HierarchyInstantiation: return 5;
        case SyntaxKind::IdWithExprCoverageBinInitializer: return 2;
        case SyntaxKind::IdentifierName: return 1;
        case SyntaxKind::IdentifierSelectName: return 2;
        case SyntaxKind::IfDefDirective: return 3;
        case SyntaxKind::IfGenerate: return 7;
        case SyntaxKind::IfNDefDirective: return 3;
        case SyntaxKind::IfNonePathDeclaration: return 3;
        case SyntaxKind::IffEventClause: return 2;
        case SyntaxKind::IffPropertyExpr: return 3;
        case SyntaxKind::ImmediateAssertStatement: return 6;
        case SyntaxKind::ImmediateAssertionMember: return 2;
        case SyntaxKind::ImmediateAssumeStatement: return 6;
        case SyntaxKind::ImmediateCoverStatement: return 6;
        case SyntaxKind::ImplementsClause: return 2;
        case SyntaxKind::ImplicationConstraint: return 3;
        case SyntaxKind::ImplicationPropertyExpr: return 3;
        case SyntaxKind::ImplicitAnsiPort: return 3;
        case SyntaxKind::ImplicitEventControl: return 4;
        case SyntaxKind::ImplicitNonAnsiPort: return 1;
        case SyntaxKind::ImplicitType: return 3;
        case SyntaxKind::ImpliesPropertyExpr: return 3;
        case SyntaxKind::IncludeDirective: return 2;
        case SyntaxKind::InequalityExpression: return 4;
        case SyntaxKind::InitialBlock: return 3;
        case SyntaxKind::InsideExpression: return 3;
        case SyntaxKind::InstanceConfigRule: return 5;
        case SyntaxKind::InstanceName: return 2;
        case SyntaxKind::IntType: return 3;
        case SyntaxKind::IntegerLiteralExpression: return 1;
        case SyntaxKind::IntegerType: return 3;
        case SyntaxKind::IntegerVectorExpression: return 3;
        case SyntaxKind::InterfaceDeclaration: return 5;
        case SyntaxKind::InterfaceHeader: return 7;
        case SyntaxKind::InterfacePortHeader: return 2;
        case SyntaxKind::IntersectClause: return 2;
        case SyntaxKind::IntersectSequenceExpr: return 3;
        case SyntaxKind::InvocationExpression: return 3;
        case SyntaxKind::JumpStatement: return 4;
        case SyntaxKind::LessThanEqualExpression: return 4;
        case SyntaxKind::LessThanExpression: return 4;
        case SyntaxKind::LetDeclaration: return 7;
        case SyntaxKind::LineDirective: return 4;
        case SyntaxKind::LocalScope: return 1;
        case SyntaxKind::LocalVariableDeclaration: return 5;
        case SyntaxKind::LogicType: return 3;
        case SyntaxKind::LogicalAndExpression: return 4;
        case SyntaxKind::LogicalEquivalenceExpression: return 4;
        case SyntaxKind::LogicalImplicationExpression: return 4;
        case SyntaxKind::LogicalLeftShiftAssignmentExpression: return 4;
        case SyntaxKind::LogicalOrExpression: return 4;
        case SyntaxKind::LogicalRightShiftAssignmentExpression: return 4;
        case SyntaxKind::LogicalShiftLeftExpression: return 4;
        case SyntaxKind::LogicalShiftRightExpression: return 4;
        case SyntaxKind::LongIntType: return 3;
        case SyntaxKind::LoopConstraint: return 3;
        case SyntaxKind::LoopGenerate: return 13;
        case SyntaxKind::LoopStatement: return 7;
        case SyntaxKind::MacroActualArgument: return 1;
        case SyntaxKind::MacroActualArgumentList: return 3;
        case SyntaxKind::MacroArgumentDefault: return 2;
        case SyntaxKind::MacroFormalArgument: return 2;
        case SyntaxKind::MacroFormalArgumentList: return 3;
        case SyntaxKind::MacroUsage: return 2;
        case SyntaxKind::MatchesClause: return 2;
        case SyntaxKind::MemberAccessExpression: return 3;
        case SyntaxKind::MinTypMaxExpression: return 5;
        case SyntaxKind::ModAssignmentExpression: return 4;
        case SyntaxKind::ModExpression: return 4;
        case SyntaxKind::ModportClockingPort: return 3;
        case SyntaxKind::ModportDeclaration: return 4;
        case SyntaxKind::ModportExplicitPort: return 5;
        case SyntaxKind::ModportItem: return 2;
        case SyntaxKind::ModportNamedPort: return 1;
        case SyntaxKind::ModportSimplePortList: return 3;
        case SyntaxKind::ModportSubroutinePort: return 1;
        case SyntaxKind::ModportSubroutinePortList: return 3;
        case SyntaxKind::ModuleDeclaration: return 5;
        case SyntaxKind::ModuleHeader: return 7;
        case SyntaxKind::MultipleConcatenationExpression: return 4;
        case SyntaxKind::MultiplyAssignmentExpression: return 4;
        case SyntaxKind::MultiplyExpression: return 4;
        case SyntaxKind::NameValuePragmaExpression: return 3;
        case SyntaxKind::NamedArgument: return 5;
        case SyntaxKind::NamedBlockClause: return 2;
        case SyntaxKind::NamedLabel: return 2;
        case SyntaxKind::NamedParamAssignment: return 5;
        case SyntaxKind::NamedPortConnection: return 6;
        case SyntaxKind::NamedStructurePatternMember: return 3;
        case SyntaxKind::NamedType: return 1;
        case SyntaxKind::NetAlias: return 4;
        case SyntaxKind::NetDeclaration: return 8;
        case SyntaxKind::NetPortHeader: return 3;
        case SyntaxKind::NetTypeDeclaration: return 6;
        case SyntaxKind::NewArrayExpression: return 5;
        case SyntaxKind::NewClassExpression: return 2;
        case SyntaxKind::NoUnconnectedDriveDirective: return 1;
        case SyntaxKind::NonAnsiPortList: return 3;
        case SyntaxKind::NonAnsiUdpPortList: return 4;
        case SyntaxKind::NonblockingAssignmentExpression: return 4;
        case SyntaxKind::NonblockingEventTriggerStatement: return 6;
        case SyntaxKind::NullLiteralExpression: return 1;
        case SyntaxKind::NumberPragmaExpression: return 3;
        case SyntaxKind::OneStepDelay: return 2;
        case SyntaxKind::OpenRangeExpression: return 5;
        case SyntaxKind::OpenRangeList: return 3;
        case SyntaxKind::OrAssignmentExpression: return 4;
        case SyntaxKind::OrPropertyExpr: return 3;
        case SyntaxKind::OrSequenceExpr: return 3;
        case SyntaxKind::OrderedArgument: return 1;
        case SyntaxKind::OrderedParamAssignment: return 1;
        case SyntaxKind::OrderedPortConnection: return 2;
        case SyntaxKind::OrderedStructurePatternMember: return 1;
        case SyntaxKind::PackageDeclaration: return 5;
        case SyntaxKind::PackageExportAllDeclaration: return 6;
        case SyntaxKind::PackageExportDeclaration: return 4;
        case SyntaxKind::PackageHeader: return 7;
        case SyntaxKind::PackageImportDeclaration: return 4;
        case SyntaxKind::PackageImportItem: return 3;
        case SyntaxKind::ParallelBlockStatement: return 7;
        case SyntaxKind::ParameterDeclaration: return 3;
        case SyntaxKind::ParameterDeclarationStatement: return 3;
        case SyntaxKind::ParameterPortList: return 4;
        case SyntaxKind::ParameterValueAssignment: return 4;
        case SyntaxKind::ParenExpressionList: return 3;
        case SyntaxKind::ParenPragmaExpression: return 3;
        case SyntaxKind::ParenthesizedBinsSelectExpr: return 3;
        case SyntaxKind::ParenthesizedEventExpression: return 3;
        case SyntaxKind::ParenthesizedExpression: return 3;
        case SyntaxKind::ParenthesizedPattern: return 3;
        case SyntaxKind::ParenthesizedPropertyExpr: return 4;
        case SyntaxKind::ParenthesizedSequenceExpr: return 5;
        case SyntaxKind::PathDeclaration: return 7;
        case SyntaxKind::PathDescription: return 7;
        case SyntaxKind::PatternCaseItem: return 5;
        case SyntaxKind::PortConcatenation: return 3;
        case SyntaxKind::PortDeclaration: return 4;
        case SyntaxKind::PortReference: return 2;
        case SyntaxKind::PostdecrementExpression: return 3;
        case SyntaxKind::PostincrementExpression: return 3;
        case SyntaxKind::PowerExpression: return 4;
        case SyntaxKind::PragmaDirective: return 3;
        case SyntaxKind::PrimaryBlockEventExpression: return 2;
        case SyntaxKind::PrimitiveInstantiation: return 6;
        case SyntaxKind::ProceduralAssignStatement: return 5;
        case SyntaxKind::ProceduralDeassignStatement: return 5;
        case SyntaxKind::ProceduralForceStatement: return 5;
        case SyntaxKind::ProceduralReleaseStatement: return 5;
        case SyntaxKind::Production: return 6;
        case SyntaxKind::ProgramDeclaration: return 5;
        case SyntaxKind::ProgramHeader: return 7;
        case SyntaxKind::PropertyDeclaration: return 10;
        case SyntaxKind::PropertySpec: return 3;
        case SyntaxKind::PropertyType: return 1;
        case SyntaxKind::PullStrength: return 3;
        case SyntaxKind::PulseStyleDeclaration: return 4;
        case SyntaxKind::QueueDimensionSpecifier: return 2;
        case SyntaxKind::RandCaseItem: return 3;
        case SyntaxKind::RandCaseStatement: return 5;
        case SyntaxKind::RandJoinClause: return 3;
        case SyntaxKind::RandSequenceStatement: return 8;
        case SyntaxKind::RangeCoverageBinInitializer: return 2;
        case SyntaxKind::RangeDimensionSpecifier: return 1;
        case SyntaxKind::RealLiteralExpression: return 1;
        case SyntaxKind::RealTimeType: return 1;
        case SyntaxKind::RealType: return 1;
        case SyntaxKind::RegType: return 3;
        case SyntaxKind::RepeatedEventControl: return 5;
        case SyntaxKind::ReplicatedAssignmentPattern: return 6;
        case SyntaxKind::ResetAllDirective: return 1;
        case SyntaxKind::RestrictPropertyStatement: return 8;
        case SyntaxKind::ReturnStatement: return 5;
        case SyntaxKind::RootScope: return 1;
        case SyntaxKind::RsCase: return 6;
        case SyntaxKind::RsCodeBlock: return 3;
        case SyntaxKind::RsElseClause: return 2;
        case SyntaxKind::RsIfElse: return 6;
        case SyntaxKind::RsProdItem: return 2;
        case SyntaxKind::RsRepeat: return 5;
        case SyntaxKind::RsRule: return 3;
        case SyntaxKind::RsWeightClause: return 3;
        case SyntaxKind::SUntilPropertyExpr: return 3;
        case SyntaxKind::SUntilWithPropertyExpr: return 3;
        case SyntaxKind::ScopedName: return 3;
        case SyntaxKind::SequenceDeclaration: return 10;
        case SyntaxKind::SequenceMatchList: return 2;
        case SyntaxKind::SequenceRepetition: return 4;
        case SyntaxKind::SequenceType: return 1;
        case SyntaxKind::SequentialBlockStatement: return 7;
        case SyntaxKind::ShortIntType: return 3;
        case SyntaxKind::ShortRealType: return 1;
        case SyntaxKind::SignalEventExpression: return 3;
        case SyntaxKind::SignedCastExpression: return 3;
        case SyntaxKind::SimpleAssignmentPattern: return 3;
        case SyntaxKind::SimpleBinsSelectExpr: return 2;
        case SyntaxKind::SimplePathSuffix: return 1;
        case SyntaxKind::SimplePragmaExpression: return 1;
        case SyntaxKind::SimplePropertyExpr: return 1;
        case SyntaxKind::SimpleRangeSelect: return 3;
        case SyntaxKind::SimpleSequenceExpr: return 2;
        case SyntaxKind::SolveBeforeConstraint: return 5;
        case SyntaxKind::SpecifyBlock: return 4;
        case SyntaxKind::SpecparamDeclaration: return 5;
        case SyntaxKind::SpecparamDeclarator: return 3;
        case SyntaxKind::StandardCaseItem: return 3;
        case SyntaxKind::StandardPropertyCaseItem: return 4;
        case SyntaxKind::StandardRsCaseItem: return 4;
        case SyntaxKind::StreamExpression: return 2;
        case SyntaxKind::StreamExpressionWithRange: return 2;
        case SyntaxKind::StreamingConcatenationExpression: return 7;
        case SyntaxKind::StringLiteralExpression: return 1;
        case SyntaxKind::StringType: return 1;
        case SyntaxKind::StrongWeakPropertyExpr: return 4;
        case SyntaxKind::StructType: return 8;
        case SyntaxKind::StructUnionMember: return 5;
        case SyntaxKind::StructurePattern: return 3;
        case SyntaxKind::StructuredAssignmentPattern: return 3;
        case SyntaxKind::SubtractAssignmentExpression: return 4;
        case SyntaxKind::SubtractExpression: return 4;
        case SyntaxKind::SuperHandle: return 1;
        case SyntaxKind::SystemName: return 1;
        case SyntaxKind::SystemTimingCheck: return 6;
        case SyntaxKind::TaggedPattern: return 3;
        case SyntaxKind::TaggedUnionExpression: return 3;
        case SyntaxKind::TaskDeclaration: return 6;
        case SyntaxKind::ThisHandle: return 1;
        case SyntaxKind::ThroughoutSequenceExpr: return 3;
        case SyntaxKind::TimeLiteralExpression: return 1;
        case SyntaxKind::TimeScaleDirective: return 4;
        case SyntaxKind::TimeType: return 3;
        case SyntaxKind::TimeUnitsDeclaration: return 5;
        case SyntaxKind::TimingCheckCondition: return 2;
        case SyntaxKind::TimingCheckEvent: return 4;
        case SyntaxKind::TimingControlExpression: return 2;
        case SyntaxKind::TimingControlStatement: return 4;
        case SyntaxKind::TransListCoverageBinInitializer: return 1;
        case SyntaxKind::TransRange: return 2;
        case SyntaxKind::TransRepeatRange: return 4;
        case SyntaxKind::TransSet: return 3;
        case SyntaxKind::TypeAssignment: return 2;
        case SyntaxKind::TypeParameterDeclaration: return 3;
        case SyntaxKind::TypeReference: return 4;
        case SyntaxKind::TypedefDeclaration: return 6;
        case SyntaxKind::UdpBody: return 5;
        case SyntaxKind::UdpDeclaration: return 7;
        case SyntaxKind::UdpEdgeIndicator: return 4;
        case SyntaxKind::UdpEntry: return 8;
        case SyntaxKind::UdpInitialStmt: return 5;
        case SyntaxKind::UdpInputPortDecl: return 3;
        case SyntaxKind::UdpOutputPortDecl: return 5;
        case SyntaxKind::UnaryBinsSelectExpr: return 2;
        case SyntaxKind::UnaryBitwiseAndExpression: return 3;
        case SyntaxKind::UnaryBitwiseNandExpression: return 3;
        case SyntaxKind::UnaryBitwiseNorExpression: return 3;
        case SyntaxKind::UnaryBitwiseNotExpression: return 3;
        case SyntaxKind::UnaryBitwiseOrExpression: return 3;
        case SyntaxKind::UnaryBitwiseXnorExpression: return 3;
        case SyntaxKind::UnaryBitwiseXorExpression: return 3;
        case SyntaxKind::UnaryLogicalNotExpression: return 3;
        case SyntaxKind::UnaryMinusExpression: return 3;
        case SyntaxKind::UnaryPlusExpression: return 3;
        case SyntaxKind::UnaryPredecrementExpression: return 3;
        case SyntaxKind::UnaryPreincrementExpression: return 3;
        case SyntaxKind::UnaryPropertyExpr: return 2;
        case SyntaxKind::UnarySelectPropertyExpr: return 5;
        case SyntaxKind::UnbasedUnsizedLiteralExpression: return 1;
        case SyntaxKind::UnconnectedDriveDirective: return 2;
        case SyntaxKind::UndefDirective: return 2;
        case SyntaxKind::UndefineAllDirective: return 1;
        case SyntaxKind::UnionType: return 8;
        case SyntaxKind::UniquenessConstraint: return 3;
        case SyntaxKind::UnitScope: return 1;
        case SyntaxKind::UntilPropertyExpr: return 3;
        case SyntaxKind::UntilWithPropertyExpr: return 3;
        case SyntaxKind::Untyped: return 1;
        case SyntaxKind::UserDefinedNetDeclaration: return 5;
        case SyntaxKind::VariableDimension: return 3;
        case SyntaxKind::VariablePattern: return 2;
        case SyntaxKind::VariablePortHeader: return 4;
        case SyntaxKind::VirtualInterfaceType: return 5;
        case SyntaxKind::VoidCastedCallStatement: return 8;
        case SyntaxKind::VoidType: return 1;
        case SyntaxKind::WaitForkStatement: return 5;
        case SyntaxKind::WaitOrderStatement: return 7;
        case SyntaxKind::WaitStatement: return 7;
        case SyntaxKind::WildcardDimensionSpecifier: return 1;
        case SyntaxKind::WildcardEqualityExpression: return 4;
        case SyntaxKind::WildcardInequalityExpression: return 4;
        case SyntaxKind::WildcardLiteralExpression: return 1;
        case SyntaxKind::WildcardPattern: return 1;
        case SyntaxKind::WildcardPortConnection: return 2;
        case SyntaxKind::WildcardPortList: return 3;
        case SyntaxKind::WildcardUdpPortList: return 4;
        case SyntaxKind::WithClause: return 4;
        case SyntaxKind::WithFunctionClause: return 2;
        case SyntaxKind::WithFunctionSample: return 4;
        case SyntaxKind::WithinSequenceExpr: return 3;
        case SyntaxKind::XorAssignmentExpression: return 4;
    }
    ASSUME_UNREACHABLE;
}